

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O0

bool isPoseApproxEqual<RSDoublelinCameraPose>
               (RSDoublelinCameraPose *pose1,RSDoublelinCameraPose *pose2)

{
  double dVar1;
  double *pdVar2;
  long in_RDI;
  RealScalar RVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  RealScalar RVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double err;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff68;
  double dVar7;
  double local_80 [2];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff98;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RVar3 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm(in_stack_ffffffffffffff68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RVar4 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm(in_stack_ffffffffffffff68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RVar5 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm(in_stack_ffffffffffffff68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RVar6 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm(in_stack_ffffffffffffff68);
  std::abs((int)in_RDI);
  local_80[0] = 1.0;
  dVar7 = extraout_XMM0_Qa;
  pdVar2 = std::max<double>((double *)(in_RDI + 0x60),local_80);
  dVar1 = *pdVar2;
  std::abs((int)in_RDI);
  return extraout_XMM0_Qa_00 + dVar7 / dVar1 + RVar6 + RVar5 + RVar4 + RVar3 < 1e-06;
}

Assistant:

bool isPoseApproxEqual(T pose1, T pose2){
    double err = (pose1.C-pose2.C).norm();   
    err += (pose1.v-pose2.v).norm();
    err += (pose1.t-pose2.t).norm();
    err += (pose1.w-pose2.w).norm();
    err += std::abs(pose1.f-pose2.f)/std::max(pose1.f,1.0);
    err += std::abs(pose1.rd-pose2.rd);
    return err < 1e-6;
}